

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

ssize_t __thiscall
kj::FileOutputStream::write(FileOutputStream *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  undefined4 in_register_00000034;
  long lVar2;
  undefined8 *puVar3;
  _func_int **local_30;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  if (__n != 0) {
    puVar3 = (undefined8 *)(__n * 0x10 + (long)__buf);
    do {
      lVar1 = *(long *)((long)__buf + 8);
      (**(code **)(**(long **)(lVar2 + 8) + 0x48))
                (*(long **)(lVar2 + 8),*(undefined8 *)(lVar2 + 0x10),*__buf,lVar1);
      *(long *)(lVar2 + 0x10) = *(long *)(lVar2 + 0x10) + lVar1;
      __buf = (void *)((long)__buf + 0x10);
    } while ((undefined8 *)__buf != puVar3);
  }
  kj::_::readyNow();
  (this->super_AsyncOutputStream)._vptr_AsyncOutputStream = local_30;
  return (ssize_t)this;
}

Assistant:

Promise<void> FileOutputStream::write(ArrayPtr<const ArrayPtr<const byte>> pieces) {
  // TODO(perf): Extend kj::File with an array-of-arrays write?
  for (auto piece: pieces) {
    file.write(offset, piece);
    offset += piece.size();
  }
  return kj::READY_NOW;
}